

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O3

int main(int argc,char **argv)

{
  Uint32 UVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  SDL_Surface *pSVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char **ppcVar9;
  ulong uVar10;
  undefined4 local_74;
  uint local_70;
  int local_6c;
  undefined8 local_60;
  undefined2 local_58;
  undefined8 local_56;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  undefined1 local_38;
  
  pcVar7 = *argv;
  local_6c = 0;
  scale = 0;
  monochrome = 0;
  luminance = 100;
  w = 0x280;
  h = 0x1e0;
  if (argc < 2) {
    local_74 = 0x32315659;
    iVar6 = 1000;
    local_70 = 0;
  }
  else {
    iVar6 = 1;
    local_70 = 0;
    local_74 = 0x32315659;
    local_6c = 0;
    do {
      pcVar8 = argv[1];
      iVar2 = strcmp(pcVar8,"-delay");
      if (iVar2 == 0) {
        if (argv[2] == (char *)0x0) {
          main_cold_11();
          return 1;
        }
        iVar6 = atoi(argv[2]);
LAB_00101ec8:
        ppcVar9 = argv + 2;
        iVar2 = -2;
      }
      else {
        iVar2 = strcmp(pcVar8,"-width");
        if (iVar2 == 0) {
          if ((argv[2] == (char *)0x0) || (w = atoi(argv[2]), w < 1)) {
            main_cold_5();
            return 1;
          }
          goto LAB_00101ec8;
        }
        iVar2 = strcmp(pcVar8,"-height");
        if (iVar2 == 0) {
          if ((argv[2] == (char *)0x0) || (h = atoi(argv[2]), h < 1)) {
            main_cold_4();
            return 1;
          }
          goto LAB_00101ec8;
        }
        iVar2 = strcmp(pcVar8,"-bpp");
        if (iVar2 == 0) {
          if (argv[2] == (char *)0x0) {
            main_cold_3();
            return 1;
          }
          local_6c = atoi(argv[2]);
          goto LAB_00101ec8;
        }
        iVar2 = strcmp(pcVar8,"-lum");
        if (iVar2 == 0) {
          if (argv[2] == (char *)0x0) {
            main_cold_2();
            return 1;
          }
          luminance = atoi(argv[2]);
          goto LAB_00101ec8;
        }
        iVar2 = strcmp(pcVar8,"-format");
        if (iVar2 == 0) {
          pcVar8 = argv[2];
          if (pcVar8 == (char *)0x0) {
            main_cold_1();
            return 1;
          }
          ppcVar9 = argv + 2;
          iVar3 = strcmp(pcVar8,"YV12");
          iVar2 = -2;
          if (iVar3 == 0) {
            local_74 = 0x32315659;
          }
          else {
            iVar3 = strcmp(pcVar8,"IYUV");
            if (iVar3 == 0) {
              local_74 = 0x56555949;
            }
            else {
              iVar3 = strcmp(pcVar8,"YUY2");
              if (iVar3 == 0) {
                local_74 = 0x32595559;
              }
              else {
                iVar3 = strcmp(pcVar8,"UYVY");
                if (iVar3 == 0) {
                  local_74 = 0x59565955;
                }
                else {
                  iVar3 = strcmp(pcVar8,"YVYU");
                  local_74 = 0x55595659;
                  if (iVar3 != 0) {
                    fprintf(_stderr,"The -format option %s is not recognized\n",pcVar8);
                    return 1;
                  }
                }
              }
            }
          }
        }
        else {
          ppcVar9 = argv + 1;
          iVar2 = strcmp(pcVar8,"-hw");
          if (iVar2 == 0) {
            local_70 = local_70 | 1;
          }
          else {
            iVar2 = strcmp(pcVar8,"-flip");
            if (iVar2 == 0) {
              local_70 = local_70 | 0x40000000;
            }
            else {
              iVar2 = strcmp(pcVar8,"-scale");
              if (iVar2 == 0) {
                scale = 1;
              }
              else {
                iVar2 = strcmp(pcVar8,"-mono");
                if (iVar2 == 0) {
                  monochrome = 1;
                }
                else {
                  iVar2 = strcmp(pcVar8,"-help");
                  if ((iVar2 == 0) ||
                     (((*pcVar8 == '-' && (pcVar8[1] == 'h')) && (pcVar8[2] == '\0')))) {
                    PrintUsage(pcVar7);
                    return 1;
                  }
                  iVar2 = strcmp(pcVar8,"-fullscreen");
                  if (iVar2 != 0) break;
                  local_70 = local_70 | 0x80000000;
                }
              }
            }
          }
          iVar2 = -1;
        }
      }
      argc = argc + iVar2;
      argv = ppcVar9;
    } while (1 < argc);
    iVar6 = iVar6 * 1000;
  }
  iVar2 = SDL_Init(0x20);
  if (iVar2 < 0) {
    main_cold_10();
    return 1;
  }
  screen = (SDL_Surface *)SDL_SetVideoMode(w,h,local_6c,local_70);
  if (screen == (SDL_Surface *)0x0) {
    main_cold_9();
LAB_00102411:
    main_cold_8();
LAB_00102419:
    main_cold_7();
  }
  else {
    pcVar7 = " fullscreen";
    if (-1 < (int)screen->flags) {
      pcVar7 = "";
    }
    printf("Set%s %dx%dx%d mode\n",pcVar7,(ulong)(uint)screen->w,(ulong)(uint)screen->h,
           (ulong)screen->format->BitsPerPixel);
    pcVar7 = "video";
    if ((screen->flags & 1) == 0) {
      pcVar7 = "system";
    }
    printf("(video surface located in %s memory)\n",pcVar7);
    if ((screen->flags & 0x40000000) != 0) {
      puts("Double-buffering enabled");
    }
    SDL_WM_SetCaption("SDL test overlay","testoverlay");
    pcVar7 = "sample.bmp";
    if (argv[1] != (char *)0x0) {
      pcVar7 = argv[1];
    }
    uVar4 = SDL_RWFromFile(pcVar7,"rb");
    pic = (SDL_Surface *)SDL_LoadBMP_RW(uVar4,1);
    if (pic == (SDL_Surface *)0x0) goto LAB_00102411;
    local_60 = 0;
    local_58 = 0x420;
    local_4c = 0xff;
    uStack_48 = 0xff00;
    uStack_44 = 0xff0000;
    uStack_40 = 0;
    local_56 = 0x10080008000000;
    local_3c = 0;
    local_38 = 0;
    pSVar5 = (SDL_Surface *)SDL_ConvertSurface(pic,&local_60,0);
    if (pSVar5 == (SDL_Surface *)0x0) goto LAB_00102419;
    SDL_FreeSurface(pic);
    pic = pSVar5;
    overlay = (SDL_Overlay *)SDL_CreateYUVOverlay(pSVar5->w,pSVar5->h,local_74,screen);
    if (overlay != (SDL_Overlay *)0x0) {
      UVar1 = overlay->format;
      pcVar7 = "hardware";
      if ((overlay->field_0x30 & 1) == 0) {
        pcVar7 = "software";
      }
      if ((int)UVar1 < 0x56555949) {
        if (UVar1 == 0x32315659) {
          pcVar8 = "YV12";
        }
        else if (UVar1 == 0x32595559) {
          pcVar8 = "YUY2";
        }
        else {
LAB_00102215:
          pcVar8 = "Unknown";
          if (UVar1 == 0x55595659) {
            pcVar8 = "YVYU";
          }
        }
      }
      else if (UVar1 == 0x56555949) {
        pcVar8 = "IYUV";
      }
      else {
        if (UVar1 != 0x59565955) goto LAB_00102215;
        pcVar8 = "UYVY";
      }
      printf("Created %dx%dx%d %s %s overlay\n",(ulong)(uint)overlay->w,(ulong)(uint)overlay->h,
             (ulong)(uint)overlay->planes,pcVar7,pcVar8);
      if (0 < overlay->planes) {
        uVar10 = 0;
        do {
          printf("  plane %d: pitch=%d\n",uVar10 & 0xffffffff,(ulong)overlay->pitches[uVar10]);
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)overlay->planes);
      }
      iVar2 = SDL_GetTicks();
      UVar1 = overlay->format;
      if (0x55595658 < (int)UVar1) {
        if (UVar1 == 0x55595659) {
          ConvertRGBtoYVYU(pic,overlay,monochrome,luminance);
        }
        else if (UVar1 == 0x56555949) {
          ConvertRGBtoIYUV(pic,overlay,monochrome,luminance);
        }
        else {
          if (UVar1 != 0x59565955) goto LAB_00102423;
          ConvertRGBtoUYVY(pic,overlay,monochrome,luminance);
        }
LAB_0010234f:
        iVar3 = SDL_GetTicks();
        printf("Conversion Time: %d milliseconds\n",(ulong)(uint)(iVar3 - iVar2));
        iVar2 = SDL_GetTicks();
        Draw();
        iVar3 = SDL_GetTicks();
        printf("Time: %d milliseconds\n",(ulong)(uint)(iVar3 - iVar2));
        SDL_Delay(iVar6);
        SDL_Quit();
        return 0;
      }
      if (UVar1 == 0x32315659) {
        ConvertRGBtoYV12(pic,overlay,monochrome,luminance);
        goto LAB_0010234f;
      }
      if (UVar1 == 0x32595559) {
        ConvertRGBtoYUY2(pic,overlay,monochrome,luminance);
        goto LAB_0010234f;
      }
      goto LAB_00102423;
    }
  }
  main_cold_6();
LAB_00102423:
  puts("cannot convert RGB picture to obtained YUV format!");
  SDL_Quit();
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	char *argv0 = argv[0];
	int delay;
	int desired_bpp;
	Uint32 video_flags, overlay_format;
	const char *bmpfile;
#ifdef BENCHMARK_SDL
	Uint32 then, now;
#endif
	int i;

	/* Set default options and check command-line */
	scale=0;
        monochrome=0;
        luminance=100;
	delay = 1;
	w = WINDOW_WIDTH;
	h = WINDOW_HEIGHT;
	desired_bpp = 0;
	video_flags = 0;
	overlay_format = SDL_YV12_OVERLAY;

	while ( argc > 1 ) {
		if ( strcmp(argv[1], "-delay") == 0 ) {
			if ( argv[2] ) {
				delay = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -delay option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-width") == 0 ) {
			if ( argv[2] && ((w = atoi(argv[2])) > 0) ) {
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -width option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-height") == 0 ) {
			if ( argv[2] && ((h = atoi(argv[2])) > 0) ) {
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -height option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-bpp") == 0 ) {
			if ( argv[2] ) {
				desired_bpp = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -bpp option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-lum") == 0 ) {
			if ( argv[2] ) {
				luminance = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -lum option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-format") == 0 ) {
			if ( argv[2] ) {
				if(!strcmp(argv[2],"YV12"))
					overlay_format = SDL_YV12_OVERLAY;
				else if(!strcmp(argv[2],"IYUV"))
					overlay_format = SDL_IYUV_OVERLAY;
				else if(!strcmp(argv[2],"YUY2"))
					overlay_format = SDL_YUY2_OVERLAY;
				else if(!strcmp(argv[2],"UYVY"))
					overlay_format = SDL_UYVY_OVERLAY;
				else if(!strcmp(argv[2],"YVYU"))
					overlay_format = SDL_YVYU_OVERLAY;
				else
				{
					fprintf(stderr, "The -format option %s is not recognized\n",argv[2]);
					return(1);
				}
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -format option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-hw") == 0 ) {
			video_flags |= SDL_HWSURFACE;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-flip") == 0 ) {
			video_flags |= SDL_DOUBLEBUF;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-scale") == 0 ) {
			scale = 1;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-mono") == 0 ) {
			monochrome = 1;
			argv += 1;
			argc -= 1;
		} else
		if (( strcmp(argv[1], "-help") == 0 ) || (strcmp(argv[1], "-h") == 0)) {
                        PrintUsage(argv0);
                        return(1);
		} else
		if ( strcmp(argv[1], "-fullscreen") == 0 ) {
			video_flags |= SDL_FULLSCREEN;
			argv += 1;
			argc -= 1;
		} else
			break;
	}
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr,
			"Couldn't initialize SDL: %s\n", SDL_GetError());
		return(1);
	}

	/* Initialize the display */
	screen = SDL_SetVideoMode(w, h, desired_bpp, video_flags);
	if ( screen == NULL ) {
		fprintf(stderr, "Couldn't set %dx%dx%d video mode: %s\n",
					w, h, desired_bpp, SDL_GetError());
		quit(1);
	}
	printf("Set%s %dx%dx%d mode\n",
			screen->flags & SDL_FULLSCREEN ? " fullscreen" : "",
			screen->w, screen->h, screen->format->BitsPerPixel);
	printf("(video surface located in %s memory)\n",
			(screen->flags&SDL_HWSURFACE) ? "video" : "system");
	if ( screen->flags & SDL_DOUBLEBUF ) {
		printf("Double-buffering enabled\n");
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption("SDL test overlay", "testoverlay");

	/* Load picture */
	bmpfile = argv[1] ? argv[1]:"sample.bmp";
	pic = SDL_LoadBMP(bmpfile);
	if ( pic == NULL ) {
		fprintf(stderr, "Couldn't load %s: %s\n", bmpfile,
							SDL_GetError());
		quit(1);
	}

	/* Convert the picture to 32bits, for easy conversion */
	{
		SDL_Surface *newsurf;
		SDL_PixelFormat format;

		format.palette=NULL;
		format.BitsPerPixel=32;
		format.BytesPerPixel=4;
#if SDL_BYTEORDER == SDL_LIL_ENDIAN
		format.Rshift=0;
		format.Gshift=8;
		format.Bshift=16;
#else
		format.Rshift=24;
		format.Gshift=16;
		format.Bshift=8;
#endif
		format.Ashift=0;
		format.Rmask=0xff<<format.Rshift;
		format.Gmask=0xff<<format.Gshift;
		format.Bmask=0xff<<format.Bshift;
		format.Amask=0;
		format.Rloss=0;
		format.Gloss=0;
		format.Bloss=0;
		format.Aloss=8;
		format.colorkey=0;
		format.alpha=0;

		newsurf=SDL_ConvertSurface(pic, &format, SDL_SWSURFACE);
		if(!newsurf)
		{
			fprintf(stderr, "Couldn't convert picture to 32bits RGB: %s\n",
							SDL_GetError());
			quit(1);
		}
		SDL_FreeSurface(pic);
		pic=newsurf;
	}
	
	/* Create the overlay */
	overlay = SDL_CreateYUVOverlay(pic->w, pic->h, overlay_format, screen);
	if ( overlay == NULL ) {
		fprintf(stderr, "Couldn't create overlay: %s\n", SDL_GetError());
		quit(1);
	}
	printf("Created %dx%dx%d %s %s overlay\n",overlay->w,overlay->h,overlay->planes,
			overlay->hw_overlay?"hardware":"software",
			overlay->format==SDL_YV12_OVERLAY?"YV12":
			overlay->format==SDL_IYUV_OVERLAY?"IYUV":
			overlay->format==SDL_YUY2_OVERLAY?"YUY2":
			overlay->format==SDL_UYVY_OVERLAY?"UYVY":
			overlay->format==SDL_YVYU_OVERLAY?"YVYU":
			"Unknown");
	for(i=0; i<overlay->planes; i++)
	{
		printf("  plane %d: pitch=%d\n", i, overlay->pitches[i]);
	}
	
	/* Convert to YUV, and draw to the overlay */
#ifdef BENCHMARK_SDL
	then = SDL_GetTicks();
#endif
	switch(overlay->format)
	{
		case SDL_YV12_OVERLAY:
			ConvertRGBtoYV12(pic,overlay,monochrome,luminance);
			break;
		case SDL_UYVY_OVERLAY:
			ConvertRGBtoUYVY(pic,overlay,monochrome,luminance);
			break;
		case SDL_YVYU_OVERLAY:
			ConvertRGBtoYVYU(pic,overlay,monochrome,luminance);
			break;
		case SDL_YUY2_OVERLAY:
			ConvertRGBtoYUY2(pic,overlay,monochrome,luminance);
			break;
		case SDL_IYUV_OVERLAY:
			ConvertRGBtoIYUV(pic,overlay,monochrome,luminance);
			break;
		default:
			printf("cannot convert RGB picture to obtained YUV format!\n");
			quit(1);
			break;
	}
#ifdef BENCHMARK_SDL
	now = SDL_GetTicks();
	printf("Conversion Time: %d milliseconds\n", now-then);
#endif
	
	/* Do all the drawing work */
#ifdef BENCHMARK_SDL
	then = SDL_GetTicks();
#endif
	Draw();
#ifdef BENCHMARK_SDL
	now = SDL_GetTicks();
	printf("Time: %d milliseconds\n", now-then);
#endif
	SDL_Delay(delay*1000);
	SDL_Quit();
	return(0);
}